

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_3c251::JSONParser::getToken(JSONParser *this)

{
  lex_state_e lVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  runtime_error *prVar5;
  long lVar6;
  ulong uVar7;
  logic_error *plVar8;
  ui val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e1;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_179;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_112;
  allocator local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_6d;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  qpdf_offset_t local_20;
  qpdf_offset_t high_offset;
  unsigned_long high_surrogate;
  JSONParser *this_local;
  
  high_surrogate = (unsigned_long)this;
  std::__cxx11::string::clear();
  high_offset = 0;
  local_20 = 0;
  while( true ) {
    while( true ) {
      if (this->p == this->buf + this->bytes) {
        this->p = this->buf;
        iVar4 = (*this->is->_vptr_InputSource[7])(this->is,this->buf,0x4000);
        this->bytes = CONCAT44(extraout_var,iVar4);
        if (this->bytes == 0) {
          this->done = true;
          goto LAB_0012af00;
        }
      }
      if ((*this->p < ' ') && (-1 < *this->p)) break;
      if (*this->p == ',') {
        if (this->lex_state == ls_top) {
          ignore(this,ls_comma);
          return;
        }
        if (this->lex_state != ls_string) goto LAB_0012af00;
        append(this);
      }
      else if (*this->p == ':') {
        if (this->lex_state == ls_top) {
          ignore(this,ls_colon);
          return;
        }
        if (this->lex_state != ls_string) goto LAB_0012af00;
        append(this);
      }
      else if (*this->p == ' ') {
        if (this->lex_state == ls_top) {
          ignore(this);
        }
        else {
          if (this->lex_state != ls_string) goto LAB_0012af00;
          append(this);
        }
      }
      else if (*this->p == '{') {
        if (this->lex_state == ls_top) {
          this->token_start = this->offset;
          ignore(this,ls_begin_dict);
          return;
        }
        if (this->lex_state != ls_string) goto LAB_0012af00;
        append(this);
      }
      else if (*this->p == '}') {
        if (this->lex_state == ls_top) {
          ignore(this,ls_end_dict);
          return;
        }
        if (this->lex_state != ls_string) goto LAB_0012af00;
        append(this);
      }
      else if (*this->p == '[') {
        if (this->lex_state == ls_top) {
          this->token_start = this->offset;
          ignore(this,ls_begin_array);
          return;
        }
        if (this->lex_state != ls_string) goto LAB_0012af00;
        append(this);
      }
      else if (*this->p == ']') {
        if (this->lex_state == ls_top) {
          ignore(this,ls_end_array);
          return;
        }
        if (this->lex_state != ls_string) goto LAB_0012af00;
        append(this);
      }
      else {
        switch(this->lex_state) {
        case ls_top:
          this->token_start = this->offset;
          if (*this->p == '\"') {
            ignore(this,ls_string);
          }
          else if ((*this->p < 'a') || ('z' < *this->p)) {
            if (*this->p == '-') {
              append(this,ls_number_minus);
            }
            else if ((*this->p < '1') || ('9' < *this->p)) {
              if (*this->p != '0') {
                QTC::TC("libtests","JSON parse bad character",0);
                local_112 = 1;
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_f0,this->offset);
                std::operator+(&local_d0,"JSON: offset ",&local_f0);
                std::operator+(&local_b0,&local_d0,": unexpected character ");
                pcVar2 = this->p;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_110,pcVar2,1,&local_111);
                std::operator+(&local_90,&local_b0,&local_110);
                std::runtime_error::runtime_error(prVar5,(string *)&local_90);
                local_112 = 0;
                __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              append(this,ls_number_leading_zero);
            }
            else {
              append(this,ls_number_before_point);
            }
          }
          else {
            append(this,ls_alpha);
          }
          break;
        case ls_number:
          if ((*this->p < '0') || ('9' < *this->p)) {
            tokenError(this);
          }
          else {
            append(this);
          }
          break;
        case ls_number_minus:
          if ((*this->p < '1') || ('9' < *this->p)) {
            if (*this->p != '0') {
              QTC::TC("libtests","JSON parse number minus no digits",0);
              local_179 = 1;
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_178,this->offset);
              std::operator+(&local_158,"JSON: offset ",&local_178);
              std::operator+(&local_138,&local_158,": numeric literal: no digit after minus sign");
              std::runtime_error::runtime_error(prVar5,(string *)&local_138);
              local_179 = 0;
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            append(this,ls_number_leading_zero);
          }
          else {
            append(this,ls_number_before_point);
          }
          break;
        case ls_number_leading_zero:
          if (*this->p == '.') {
            append(this,ls_number_point);
          }
          else {
            if ((*this->p != 'e') && (*this->p != 'E')) {
              QTC::TC("libtests","JSON parse leading zero",0);
              local_1e1 = 1;
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_1e0,this->offset);
              std::operator+(&local_1c0,"JSON: offset ",&local_1e0);
              std::operator+(&local_1a0,&local_1c0,": number with leading zero");
              std::runtime_error::runtime_error(prVar5,(string *)&local_1a0);
              local_1e1 = 0;
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            append(this,ls_number_e);
          }
          break;
        case ls_number_before_point:
          if ((*this->p < '0') || ('9' < *this->p)) {
            if (*this->p == '.') {
              append(this,ls_number_point);
            }
            else if ((*this->p == 'e') || (*this->p == 'E')) {
              append(this,ls_number_e);
            }
            else {
              tokenError(this);
            }
          }
          else {
            append(this);
          }
          break;
        case ls_number_point:
          if ((*this->p < '0') || ('9' < *this->p)) {
            tokenError(this);
          }
          else {
            append(this,ls_number_after_point);
          }
          break;
        case ls_number_after_point:
          if ((*this->p < '0') || ('9' < *this->p)) {
            if ((*this->p == 'e') || (*this->p == 'E')) {
              append(this,ls_number_e);
            }
            else {
              tokenError(this);
            }
          }
          else {
            append(this);
          }
          break;
        case ls_number_e:
          if ((*this->p < '0') || ('9' < *this->p)) {
            if ((*this->p == '+') || (*this->p == '-')) {
              append(this,ls_number_e_sign);
            }
            else {
              tokenError(this);
            }
          }
          else {
            append(this,ls_number);
          }
          break;
        case ls_number_e_sign:
          if ((*this->p < '0') || ('9' < *this->p)) {
            tokenError(this);
          }
          else {
            append(this,ls_number);
          }
          break;
        case ls_alpha:
          if ((*this->p < 'a') || ('z' < *this->p)) {
            tokenError(this);
          }
          else {
            append(this);
          }
          break;
        case ls_string:
          if (*this->p == '\"') {
            if (local_20 == 0) {
              ignore(this,ls_after_string);
              return;
            }
            QTC::TC("libtests","JSON 16 dangling high",0);
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string((string *)&val,local_20);
            std::operator+(&local_228,"JSON: offset ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val
                          );
            std::operator+(&local_208,&local_228,
                           ": UTF-16 high surrogate not followed by low surrogate");
            std::runtime_error::runtime_error(prVar5,(string *)&local_208);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (*this->p == '\\') {
            ignore(this,ls_backslash);
          }
          else {
            append(this);
          }
          break;
        default:
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (plVar8,"JSONParser::getToken : trying to handle delimiter state");
          __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        case ls_backslash:
          this->lex_state = ls_string;
          switch(*this->p) {
          case '\"':
          case '/':
          case '\\':
            std::__cxx11::string::operator+=((string *)&this->token,*this->p);
            break;
          default:
            this->lex_state = ls_backslash;
            tokenError(this);
            break;
          case 'b':
            std::__cxx11::string::operator+=((string *)&this->token,'\b');
            break;
          case 'f':
            std::__cxx11::string::operator+=((string *)&this->token,'\f');
            break;
          case 'n':
            std::__cxx11::string::operator+=((string *)&this->token,'\n');
            break;
          case 'r':
            std::__cxx11::string::operator+=((string *)&this->token,'\r');
            break;
          case 't':
            std::__cxx11::string::operator+=((string *)&this->token,'\t');
            break;
          case 'u':
            this->lex_state = ls_u4;
            this->u_count = 0;
            this->u_value = 0;
          }
          ignore(this);
          break;
        case ls_u4:
          cVar3 = ::qpdf::util::hex_decode_char(*this->p);
          if ((uint)(int)cVar3 < 0x10) {
            this->u_value = this->u_value * 0x10 + (ulong)(uint)(int)cVar3;
          }
          else {
            tokenError(this);
          }
          lVar6 = this->u_count + 1;
          this->u_count = lVar6;
          if (lVar6 == 4) {
            handle_u_code(this->u_value,this->offset + -5,(unsigned_long *)&high_offset,&local_20,
                          &this->token);
            this->lex_state = ls_string;
          }
          ignore(this);
        }
      }
    }
    if (((*this->p != '\t') && (*this->p != '\n')) && (*this->p != '\r')) {
      QTC::TC("libtests","JSON parse null character",0);
      local_6d = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_60,this->offset);
      std::operator+(&local_40,"JSON: control or null character at offset ",&local_60);
      std::runtime_error::runtime_error(prVar5,(string *)&local_40);
      local_6d = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->lex_state != ls_top) break;
    ignore(this);
  }
LAB_0012af00:
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    lVar1 = this->lex_state;
    if (lVar1 == ls_top) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar8,"tok_start set in ls_top while parsing");
      __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (lVar1 != ls_number) {
      if ((lVar1 - ls_number_leading_zero < 2) || (lVar1 == ls_number_after_point)) {
        this->lex_state = ls_number;
      }
      else if (lVar1 != ls_alpha) {
        tokenError(this);
      }
    }
  }
  return;
}

Assistant:

void
JSONParser::getToken()
{
    token.clear();

    // Keep track of UTF-16 surrogate pairs.
    unsigned long high_surrogate = 0;
    qpdf_offset_t high_offset = 0;

    while (true) {
        if (p == (buf + bytes)) {
            p = buf;
            bytes = is.read(buf, sizeof(buf));
            if (bytes == 0) {
                done = true;
                break;
            }
        }

        if ((*p < 32 && *p >= 0)) {
            if (*p == '\t' || *p == '\n' || *p == '\r') {
                // Legal white space not permitted in strings. This will always end the current
                // token (unless we are still before the start of the token).
                if (lex_state == ls_top) {
                    ignore();
                } else {
                    break;
                }

            } else {
                QTC::TC("libtests", "JSON parse null character");
                throw std::runtime_error(
                    "JSON: control or null character at offset " + std::to_string(offset));
            }
        } else if (*p == ',') {
            if (lex_state == ls_top) {
                ignore(ls_comma);
                return;
            } else if (lex_state == ls_string) {
                append();
            } else {
                break;
            }
        } else if (*p == ':') {
            if (lex_state == ls_top) {
                ignore(ls_colon);
                return;
            } else if (lex_state == ls_string) {
                append();
            } else {
                break;
            }
        } else if (*p == ' ') {
            if (lex_state == ls_top) {
                ignore();
            } else if (lex_state == ls_string) {
                append();
            } else {
                break;
            }
        } else if (*p == '{') {
            if (lex_state == ls_top) {
                token_start = offset;
                ignore(ls_begin_dict);
                return;
            } else if (lex_state == ls_string) {
                append();
            } else {
                break;
            }
        } else if (*p == '}') {
            if (lex_state == ls_top) {
                ignore(ls_end_dict);
                return;
            } else if (lex_state == ls_string) {
                append();
            } else {
                break;
            }
        } else if (*p == '[') {
            if (lex_state == ls_top) {
                token_start = offset;
                ignore(ls_begin_array);
                return;
            } else if (lex_state == ls_string) {
                append();
            } else {
                break;
            }
        } else if (*p == ']') {
            if (lex_state == ls_top) {
                ignore(ls_end_array);
                return;
            } else if (lex_state == ls_string) {
                append();
            } else {
                break;
            }
        } else {
            switch (lex_state) {
            case ls_top:
                token_start = offset;
                if (*p == '"') {
                    ignore(ls_string);
                } else if ((*p >= 'a') && (*p <= 'z')) {
                    append(ls_alpha);
                } else if (*p == '-') {
                    append(ls_number_minus);
                } else if ((*p >= '1') && (*p <= '9')) {
                    append(ls_number_before_point);
                } else if (*p == '0') {
                    append(ls_number_leading_zero);
                } else {
                    QTC::TC("libtests", "JSON parse bad character");
                    throw std::runtime_error(
                        "JSON: offset " + std::to_string(offset) + ": unexpected character " +
                        std::string(p, 1));
                }
                break;

            case ls_number_minus:
                if ((*p >= '1') && (*p <= '9')) {
                    append(ls_number_before_point);
                } else if (*p == '0') {
                    append(ls_number_leading_zero);
                } else {
                    QTC::TC("libtests", "JSON parse number minus no digits");
                    throw std::runtime_error(
                        "JSON: offset " + std::to_string(offset) +
                        ": numeric literal: no digit after minus sign");
                }
                break;

            case ls_number_leading_zero:
                if (*p == '.') {
                    append(ls_number_point);
                } else if (*p == 'e' || *p == 'E') {
                    append(ls_number_e);
                } else {
                    QTC::TC("libtests", "JSON parse leading zero");
                    throw std::runtime_error(
                        "JSON: offset " + std::to_string(offset) + ": number with leading zero");
                }
                break;

            case ls_number_before_point:
                if ((*p >= '0') && (*p <= '9')) {
                    append();
                } else if (*p == '.') {
                    append(ls_number_point);
                } else if (*p == 'e' || *p == 'E') {
                    append(ls_number_e);
                } else {
                    tokenError();
                }
                break;

            case ls_number_point:
                if ((*p >= '0') && (*p <= '9')) {
                    append(ls_number_after_point);
                } else {
                    tokenError();
                }
                break;

            case ls_number_after_point:
                if ((*p >= '0') && (*p <= '9')) {
                    append();
                } else if (*p == 'e' || *p == 'E') {
                    append(ls_number_e);
                } else {
                    tokenError();
                }
                break;

            case ls_number_e:
                if ((*p >= '0') && (*p <= '9')) {
                    append(ls_number);
                } else if ((*p == '+') || (*p == '-')) {
                    append(ls_number_e_sign);
                } else {
                    tokenError();
                }
                break;

            case ls_number_e_sign:
                if ((*p >= '0') && (*p <= '9')) {
                    append(ls_number);
                } else {
                    tokenError();
                }
                break;

            case ls_number:
                // We only get here after we have seen an exponent.
                if ((*p >= '0') && (*p <= '9')) {
                    append();
                } else {
                    tokenError();
                }
                break;

            case ls_alpha:
                if ((*p >= 'a') && (*p <= 'z')) {
                    append();
                } else {
                    tokenError();
                }
                break;

            case ls_string:
                if (*p == '"') {
                    if (high_offset) {
                        QTC::TC("libtests", "JSON 16 dangling high");
                        throw std::runtime_error(
                            "JSON: offset " + std::to_string(high_offset) +
                            ": UTF-16 high surrogate not followed by low surrogate");
                    }
                    ignore(ls_after_string);
                    return;
                } else if (*p == '\\') {
                    ignore(ls_backslash);
                } else {
                    append();
                }
                break;

            case ls_backslash:
                lex_state = ls_string;
                switch (*p) {
                case '\\':
                case '\"':
                case '/':
                    // \/ is allowed in json input, but so is /, so we don't map / to \/ in output.
                    token += *p;
                    break;
                case 'b':
                    token += '\b';
                    break;
                case 'f':
                    token += '\f';
                    break;
                case 'n':
                    token += '\n';
                    break;
                case 'r':
                    token += '\r';
                    break;
                case 't':
                    token += '\t';
                    break;
                case 'u':
                    lex_state = ls_u4;
                    u_count = 0;
                    u_value = 0;
                    break;
                default:
                    lex_state = ls_backslash;
                    tokenError();
                }
                ignore();
                break;

            case ls_u4:
                using ui = unsigned int;
                if (ui val = ui(util::hex_decode_char(*p)); val < 16) {
                    u_value = 16 * u_value + val;
                } else {
                    tokenError();
                }
                if (++u_count == 4) {
                    handle_u_code(u_value, offset - 5, high_surrogate, high_offset, token);
                    lex_state = ls_string;
                }
                ignore();
                break;

            default:
                throw std::logic_error("JSONParser::getToken : trying to handle delimiter state");
            }
        }
    }

    // We only get here if on end of input or if the last character was a control character or other
    // delimiter.

    if (!token.empty()) {
        switch (lex_state) {
        case ls_top:
            // Can't happen
            throw std::logic_error("tok_start set in ls_top while parsing");
            break;

        case ls_number_leading_zero:
        case ls_number_before_point:
        case ls_number_after_point:
            lex_state = ls_number;
            break;

        case ls_number:
        case ls_alpha:
            // terminal state
            break;

        default:
            tokenError();
        }
    }
}